

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O1

void Assimp::Bitmap::WriteData(aiTexture *texture,IOStream *file)

{
  aiTexel *paVar1;
  undefined8 in_RAX;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint8_t pixel [4];
  undefined8 uStack_38;
  
  if (texture->mHeight != 0) {
    lVar5 = -1;
    uVar4 = 0;
    uStack_38 = in_RAX;
    do {
      uVar2 = (ulong)texture->mWidth;
      if (uVar2 != 0) {
        uVar6 = 0;
        do {
          lVar3 = ((ulong)texture->mHeight + lVar5) * uVar2;
          paVar1 = texture->pcData;
          uStack_38 = CONCAT17(paVar1[lVar3 + uVar6].a,
                               CONCAT16(paVar1[lVar3 + uVar6].b,
                                        CONCAT15(paVar1[lVar3 + uVar6].g,
                                                 CONCAT14(paVar1[lVar3 + uVar6].r,
                                                          (undefined4)uStack_38))));
          (*file->_vptr_IOStream[3])(file,(long)&uStack_38 + 4,4,1);
          uVar6 = uVar6 + 1;
          uVar2 = (ulong)texture->mWidth;
        } while (uVar6 < uVar2);
      }
      (*file->_vptr_IOStream[3])(file,"",0,1);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + -1;
    } while (uVar4 < texture->mHeight);
  }
  return;
}

Assistant:

void Bitmap::WriteData(aiTexture* texture, IOStream* file) {
        static const std::size_t padding_offset = 4;
        static const uint8_t padding_data[padding_offset] = {0x0, 0x0, 0x0, 0x0};

        unsigned int padding = (padding_offset - ((mBytesPerPixel * texture->mWidth) % padding_offset)) % padding_offset;
        uint8_t pixel[mBytesPerPixel];

        for(std::size_t i = 0; i < texture->mHeight; ++i) {
            for(std::size_t j = 0; j < texture->mWidth; ++j) {
                const aiTexel& texel = texture->pcData[(texture->mHeight - i - 1) * texture->mWidth + j]; // Bitmap files are stored in bottom-up format

                pixel[0] = texel.r;
                pixel[1] = texel.g;
                pixel[2] = texel.b;
                pixel[3] = texel.a;

                file->Write(pixel, mBytesPerPixel, 1);
            }

            file->Write(padding_data, padding, 1);
        }
    }